

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.h
# Opt level: O3

BasicTypeInfo<std::vector<dap::CompletionItem,_std::allocator<dap::CompletionItem>_>_> *
dap::TypeInfo::
create<dap::BasicTypeInfo<std::vector<dap::CompletionItem,std::allocator<dap::CompletionItem>>>,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  BasicTypeInfo<std::vector<dap::CompletionItem,_std::allocator<dap::CompletionItem>_>_> *ti;
  
  ti = (BasicTypeInfo<std::vector<dap::CompletionItem,_std::allocator<dap::CompletionItem>_>_> *)
       operator_new(0x28);
  (ti->super_TypeInfo)._vptr_TypeInfo = (_func_int **)&PTR__BasicTypeInfo_00bd7300;
  paVar1 = &(ti->name_).field_2;
  (ti->name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (args->_M_dataplus)._M_p;
  paVar2 = &args->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&args->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(ti->name_).field_2 + 8) = uVar4;
  }
  else {
    (ti->name_)._M_dataplus._M_p = pcVar3;
    (ti->name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (ti->name_)._M_string_length = args->_M_string_length;
  (args->_M_dataplus)._M_p = (pointer)paVar2;
  args->_M_string_length = 0;
  (args->field_2)._M_local_buf[0] = '\0';
  deleteOnExit((TypeInfo *)ti);
  return ti;
}

Assistant:

static T* create(ARGS&&... args) {
    auto typeinfo = new T(std::forward<ARGS>(args)...);
    deleteOnExit(typeinfo);
    return typeinfo;
  }